

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O2

UINT8 device_start_multipcm(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  double dVar1;
  int iVar2;
  DEV_DATA info;
  long lVar3;
  INT32 *pIVar4;
  INT32 (*paIVar5) [256];
  UINT8 UVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  INT32 (*paIVar11) [256];
  long lVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  info.chipInf = calloc(1,0x2658);
  if ((DEV_DATA *)info.chipInf == (DEV_DATA *)0x0) {
    UVar6 = 0xff;
  }
  else {
    fVar14 = (float)cfg->clock / 224.0;
    *(float *)((long)info.chipInf + 0x143c) = fVar14;
    if (IsInit == '\0') {
      IsInit = '\x01';
      lVar13 = 0;
      for (lVar3 = 0; lVar3 != 0x80; lVar3 = lVar3 + 1) {
        fVar15 = powf(10.0,((float)(int)lVar3 * -24.0 * 0.015625) / 20.0);
        uVar10 = 0x10;
        lVar12 = lVar13;
        for (uVar7 = 0; uVar7 != 0x10; uVar7 = uVar7 + 1) {
          iVar2 = (int)uVar7;
          if (iVar2 == 8) {
            fVar16 = 0.0;
            fVar17 = 0.0;
          }
          else if (iVar2 == 0) {
            fVar17 = 1.0;
            fVar16 = 1.0;
          }
          else if (uVar7 < 8) {
            fVar16 = powf(10.0,((float)iVar2 * -12.0 * 0.25) / 20.0);
            fVar17 = 0.0;
            if (uVar7 != 7) {
              fVar17 = fVar16;
            }
            fVar16 = 1.0;
          }
          else {
            fVar17 = powf(10.0,((float)(int)uVar10 * -12.0 * 0.25) / 20.0);
            fVar16 = 0.0;
            if ((~uVar10 & 7) != 0) {
              fVar16 = fVar17;
            }
            fVar17 = 1.0;
          }
          *(int *)((long)left_pan_table + lVar12) = (int)(long)(fVar17 * fVar15 * 0.25 * 4096.0);
          *(int *)((long)right_pan_table + lVar12) = (int)(long)(fVar16 * fVar15 * 0.25 * 4096.0);
          uVar10 = uVar10 - 1;
          lVar12 = lVar12 + 0x200;
        }
        lVar13 = lVar13 + 4;
      }
      pIVar4 = linear_to_exp_volume;
      for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
        fVar15 = powf(10.0,((float)(int)lVar3 * 96.0 * -0.0009765625 + 96.0) / -20.0);
        *pIVar4 = (INT32)(long)(fVar15 * 4096.0);
        pIVar4 = pIVar4 + 1;
      }
      iVar2 = 0xff;
      lVar13 = 0;
      uVar7 = 0;
      for (lVar3 = -0x200; lVar3 != 0; lVar3 = lVar3 + 2) {
        iVar8 = (int)lVar3;
        if (uVar7 < 0x40) {
          iVar8 = iVar8 + 0x280;
LAB_0014d6ca:
          *(int *)((long)pitch_table + lVar13) = iVar8;
          *(int *)((long)amplitude_table + lVar13) = iVar2;
        }
        else {
          if (uVar7 < 0x80) {
            iVar8 = iVar2 + 0x80;
            goto LAB_0014d6ca;
          }
          iVar9 = iVar8;
          if (uVar7 < 0xc0) {
            iVar9 = iVar2;
          }
          *(int *)((long)pitch_table + lVar13) = iVar9 + 0x81;
          *(int *)((long)amplitude_table + lVar13) = iVar8 + 0x100;
        }
        uVar7 = uVar7 + 1;
        iVar2 = iVar2 + -2;
        lVar13 = lVar13 + 4;
      }
      paIVar5 = pitch_scale_tables;
      paIVar11 = amplitude_scale_tables;
      for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
        fVar15 = PHASE_SCALE_LIMIT[lVar3];
        for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
          fVar16 = exp2f(((float)((int)lVar13 + -0x80) * fVar15 * 0.0078125) / 1200.0);
          (*paIVar5)[lVar13] = (INT32)(long)(fVar16 * 256.0);
        }
        fVar15 = AMPLITUDE_SCALE_LIMIT[lVar3];
        for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
          fVar16 = powf(10.0,((float)(int)lVar13 * -fVar15 * 0.00390625) / 20.0);
          (*paIVar11)[lVar13] = (INT32)(long)(fVar16 * 256.0);
        }
        paIVar5 = paIVar5 + 1;
        paIVar11 = paIVar11 + 1;
      }
    }
    for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
      *(int *)((long)info.chipInf + lVar3 * 4 + 0x1640) =
           (int)(long)(((float)(int)lVar3 + 1024.0) * fVar14 * 0.0009765625 * 4096.0);
    }
    for (lVar3 = 0; lVar3 != 0x3c; lVar3 = lVar3 + 1) {
      dVar1 = BASE_TIMES[lVar3 + 4];
      *(int *)((long)info.chipInf + lVar3 * 4 + 0x1450) =
           (int)(long)(67108864.0 / (float)((dVar1 * 44100.0) / 1000.0));
      *(int *)((long)info.chipInf + lVar3 * 4 + 0x1550) =
           (int)(long)(67108864.0 / (float)((dVar1 * 14.32833 * 44100.0) / 1000.0));
    }
    ((DEV_DATA *)((long)info.chipInf + 0x1440))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x1448))->chipInf = (void *)0x0;
    *(undefined4 *)((long)info.chipInf + 0x153c) = 0x4000000;
    ((DEV_DATA *)((long)info.chipInf + 0x1540))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x1548))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)info.chipInf + 0x2640))->chipInf = (void *)0x4cffffff68;
    UVar6 = '\0';
    multipcm_set_mute_mask(info.chipInf,0);
    *(void **)info.chipInf = info.chipInf;
    fVar14 = *(float *)((long)info.chipInf + 0x143c);
    retDevInf->dataPtr = (DEV_DATA *)info.chipInf;
    retDevInf->sampleRate = (UINT32)(long)fVar14;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar6;
}

Assistant:

static UINT8 device_start_multipcm(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	MultiPCM *ptChip;
	INT32 i;

	ptChip = (MultiPCM *)calloc(1, sizeof(MultiPCM));
	if (ptChip == NULL)
		return 0xFF;
	
	ptChip->ROM = NULL;
	ptChip->ROMSize = 0x00;
	ptChip->ROMMask = 0x00;
	ptChip->rate = (float)cfg->clock / MULTIPCM_CLOCKDIV;

	if (! IsInit)
	{
	INT32 level;

	IsInit = 1;

	// Volume + pan table
	for (level = 0; level < 0x80; ++level)
	{
		const float vol_db = (float)level * (-24.0f) / 64.0f;
		const float total_level = powf(10.0f, vol_db / 20.0f) / 4.0f;
		INT32 pan;

		for (pan = 0; pan < 0x10; ++pan)
		{
			float pan_left, pan_right;
			if (pan == 0x8)
			{
				pan_left = 0.0;
				pan_right = 0.0;
			}
			else if (pan == 0x0)
			{
				pan_left = 1.0;
				pan_right = 1.0;
			}
			else if (pan & 0x8)
			{
				const INT32 inverted_pan = 0x10 - pan;
				const float pan_vol_db = (float)inverted_pan * (-12.0f) / 4.0f;

				pan_left = 1.0;
				pan_right = powf(10.0f, pan_vol_db / 20.0f);

				if ((inverted_pan & 0x7) == 7)
				{
					pan_right = 0.0;
				}
			}
			else
			{
				const float pan_vol_db = (float)pan * (-12.0f) / 4.0f;

				pan_left = powf(10.0f, pan_vol_db / 20.0f);
				pan_right = 1.0;

				if ((pan & 0x7) == 7)
				{
					pan_left = 0.0;
				}
			}

			left_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_left * total_level);
			right_pan_table[(pan << 7) | level] = value_to_fixed(TL_SHIFT, pan_right * total_level);
		}
	}

	// build the linear->exponential ramps
	for(i = 0; i < 0x400; ++i)
	{
		const float db = -(96.0f - (96.0f * (float)i / (float)0x400));
		const float exp_volume = powf(10.0f, db / 20.0f);
		linear_to_exp_volume[i] = value_to_fixed(TL_SHIFT, exp_volume);
	}

	lfo_init();
	}

	// Pitch steps
	for (i = 0; i < 0x400; ++i)
	{
		const float fcent = ptChip->rate * (1024.0f + (float)i) / 1024.0f;
		ptChip->freq_step_table[i] = value_to_fixed(TL_SHIFT, fcent);
	}

	// Envelope steps
	envelope_generator_init(ptChip, BASE_TIMES, 14.32833);

	// Total level interpolation steps
	ptChip->total_level_steps[0] = -(float)(0x80 << TL_SHIFT) / (78.2f * 44100.0f / 1000.0f); // lower
	ptChip->total_level_steps[1] = (float)(0x80 << TL_SHIFT) / (78.2f * 2 * 44100.0f / 1000.0f); // raise

	multipcm_set_mute_mask(ptChip, 0x00);

	ptChip->_devData.chipInf = ptChip;
	INIT_DEVINF(retDevInf, &ptChip->_devData, (UINT32)ptChip->rate, &devDef);

	return 0x00;
}